

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

void delpostest(int i)

{
  void *e;
  void *local_20;
  void *ret;
  void *elem;
  int index;
  int i_local;
  
  e = array[i];
  for (elem._4_4_ = i; elem._4_4_ < arraylen + -1; elem._4_4_ = elem._4_4_ + 1) {
    array[elem._4_4_] = array[elem._4_4_ + 1];
  }
  arraylen = arraylen + -1;
  if (tree->cmp == (cmpfn234)0x0) {
    local_20 = delpos234(tree,i);
  }
  else {
    local_20 = del234(tree,e);
  }
  if (local_20 != e) {
    error("del returned %p, expected %p",local_20,e);
  }
  verify();
  return;
}

Assistant:

void delpostest(int i)
{
    int index = i;
    void *elem = array[i], *ret;

    /* i points to the right element */
    while (i < arraylen - 1) {
        array[i] = array[i + 1];
        i++;
    }
    arraylen--;                        /* delete elem from array */

    if (tree->cmp)
        ret = del234(tree, elem);
    else
        ret = delpos234(tree, index);

    if (ret != elem) {
        error("del returned %p, expected %p", ret, elem);
    }

    verify();
}